

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ExtPubkey *
cfd::core::ConfidentialTransaction::GenerateExtPubkeyFromDescriptor
          (ExtPubkey *__return_storage_ptr__,string *bitcoin_descriptor,uint32_t bip32_counter,
          ByteData *prefix,NetType net_type,NetType elements_net_type,ExtPubkey *base_ext_pubkey,
          Address *descriptor_derive_address)

{
  bool bVar1;
  __type _Var2;
  AddressType AVar3;
  CfdException *pCVar4;
  reference pvVar5;
  Address local_24a0;
  ExtPubkey local_2328;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_22b8;
  DescriptorScriptReference local_22a0;
  DescriptorScriptReference local_1f50;
  Descriptor local_1c00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19f8;
  string local_19d8;
  undefined1 local_19b8 [8];
  string xpub_str;
  string local_1978;
  ExtPubkey local_1958;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_18e8;
  DescriptorScriptReference local_18d0;
  DescriptorScriptReference local_1580;
  undefined1 local_1230 [8];
  DescriptorScriptReference derive_script;
  string local_ed8;
  ByteData local_eb8;
  string local_ea0;
  CfdSourceLocation local_e80;
  ByteData local_e68;
  ExtPubkey local_e50;
  undefined1 local_dda;
  allocator local_dd9;
  string local_dd8;
  CfdSourceLocation local_db8;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_da0;
  undefined1 local_d88 [8];
  DescriptorKeyReference key_ref;
  allocator local_7a1;
  string local_7a0;
  CfdSourceLocation local_780;
  undefined1 local_762;
  allocator local_761;
  string local_760;
  AddressType local_73c;
  CfdSourceLocation local_738;
  undefined1 local_720 [8];
  DescriptorScriptReference script_ref;
  Descriptor desc;
  undefined1 local_248 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list;
  value_type local_228;
  undefined1 local_208 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list_base;
  CfdException *except;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ByteData local_188;
  undefined1 local_170 [8];
  ExtPubkey check_key;
  string desc_str;
  ExtPubkey xpub;
  allocator local_59;
  string local_58;
  byte local_31;
  NetType local_30;
  NetType NStack_2c;
  bool is_liquidv1;
  NetType elements_net_type_local;
  NetType net_type_local;
  ByteData *prefix_local;
  string *psStack_18;
  uint32_t bip32_counter_local;
  string *bitcoin_descriptor_local;
  ExtPubkey *child_xpub;
  
  local_31 = 0;
  local_30 = elements_net_type;
  NStack_2c = net_type;
  _elements_net_type_local = prefix;
  prefix_local._4_4_ = bip32_counter;
  psStack_18 = bitcoin_descriptor;
  bitcoin_descriptor_local = (string *)__return_storage_ptr__;
  if (elements_net_type < kLiquidV1) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_58,"Illegal elements network type error.",&local_59);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_58);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_31 = elements_net_type == kLiquidV1;
  ExtPubkey::ExtPubkey(__return_storage_ptr__);
  ExtPubkey::ExtPubkey((ExtPubkey *)((long)&desc_str.field_2 + 8));
  ::std::__cxx11::string::string
            ((string *)
             &check_key.tweak_sum_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(string *)psStack_18);
  ExtPubkey::ExtPubkey((ExtPubkey *)local_170,psStack_18);
  ExtPubkey::GetVersionData(&local_188,(ExtPubkey *)local_170);
  bVar1 = ByteData::Equals(&local_188,_elements_net_type_local);
  ByteData::~ByteData(&local_188);
  if (bVar1) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&except,
                     "pkh(",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            psStack_18);
    ::std::operator+(&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&except,
                     ")");
    ::std::__cxx11::string::operator=
              ((string *)
               &check_key.tweak_sum_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1a8);
    ::std::__cxx11::string::~string((string *)&except);
  }
  ExtPubkey::~ExtPubkey((ExtPubkey *)local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_208);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_228,"base",
             (allocator *)
             ((long)&arg_list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208,&local_228);
  ::std::__cxx11::string::~string((string *)&local_228);
  ::std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&arg_list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_248);
  ::std::__cxx11::to_string
            ((string *)((long)&desc.root_node_.parent_kind_.field_2 + 8),prefix_local._4_4_);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_248,(value_type *)((long)&desc.root_node_.parent_kind_.field_2 + 8));
  ::std::__cxx11::string::~string((string *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 8))
  ;
  Descriptor::Parse((Descriptor *)
                    &script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (string *)
                    &check_key.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     *)0x0);
  Descriptor::GetReference
            ((DescriptorScriptReference *)local_720,
             (Descriptor *)
             &script_ref.addr_prefixes_.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_208);
  AVar3 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_720);
  if (AVar3 != kP2pkhAddress) {
    if ((AVar3 != kP2wpkhAddress) && (AVar3 != kP2shP2wpkhAddress)) {
      local_780.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_780.filename = local_780.filename + 1;
      local_780.line = 0xcec;
      local_780.funcname = "GenerateExtPubkeyFromDescriptor";
      logger::warn<>(&local_780,"bitcoin_descriptor invalid type.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_7a0,
                 "bitcoin_descriptor is not of any type supported: pkh(<xpub>), sh(wpkh(<xpub>)), wpkh(<xpub>), or <xpub>."
                 ,&local_7a1);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_7a0);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((local_31 & 1) != 0) {
      local_738.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_738.filename = local_738.filename + 1;
      local_738.line = 0xce4;
      local_738.funcname = "GenerateExtPubkeyFromDescriptor";
      local_73c = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_720);
      logger::warn<cfd::core::AddressType>
                (&local_738,"liquidv1 not supported address type[{}].",&local_73c);
      local_762 = 1;
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_760,"bitcoin_descriptor is not of any type supported: pkh(<xpub>)"
                 ,&local_761);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_760);
      local_762 = 0;
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  AVar3 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_720);
  if (AVar3 == kP2shP2wpkhAddress) {
    DescriptorScriptReference::GetChild
              ((DescriptorScriptReference *)((long)&key_ref.argument_.field_2 + 8),
               (DescriptorScriptReference *)local_720);
    DescriptorScriptReference::operator=
              ((DescriptorScriptReference *)local_720,
               (DescriptorScriptReference *)((long)&key_ref.argument_.field_2 + 8));
    DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)((long)&key_ref.argument_.field_2 + 8));
  }
  DescriptorScriptReference::GetKeyList(&local_da0,(DescriptorScriptReference *)local_720);
  pvVar5 = ::std::
           vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
           ::operator[](&local_da0,0);
  DescriptorKeyReference::DescriptorKeyReference((DescriptorKeyReference *)local_d88,pvVar5);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  ~vector(&local_da0);
  bVar1 = DescriptorKeyReference::HasExtPubkey((DescriptorKeyReference *)local_d88);
  if (!bVar1) {
    local_db8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_db8.filename = local_db8.filename + 1;
    local_db8.line = 0xcf8;
    local_db8.funcname = "GenerateExtPubkeyFromDescriptor";
    logger::warn<>(&local_db8,"bitcoin_descriptor invalid extkey format.");
    local_dda = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_dd8,"BitcoinDescriptor invalid extkey format.",&local_dd9);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_dd8);
    local_dda = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  DescriptorKeyReference::GetExtPubkey(&local_e50,(DescriptorKeyReference *)local_d88);
  ExtPubkey::operator=(base_ext_pubkey,&local_e50);
  ExtPubkey::~ExtPubkey(&local_e50);
  ExtPubkey::GetVersionData(&local_e68,base_ext_pubkey);
  bVar1 = ByteData::Equals(&local_e68,_elements_net_type_local);
  ByteData::~ByteData(&local_e68);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    DescriptorScriptReference::DescriptorScriptReference((DescriptorScriptReference *)local_1230);
    Descriptor::GetReference
              (&local_1580,
               (Descriptor *)
               &script_ref.addr_prefixes_.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_248);
    DescriptorScriptReference::operator=((DescriptorScriptReference *)local_1230,&local_1580);
    DescriptorScriptReference::~DescriptorScriptReference(&local_1580);
    DescriptorScriptReference::operator=
              ((DescriptorScriptReference *)local_720,(DescriptorScriptReference *)local_1230);
    AVar3 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_720);
    if (AVar3 == kP2shP2wpkhAddress) {
      DescriptorScriptReference::GetChild(&local_18d0,(DescriptorScriptReference *)local_720);
      DescriptorScriptReference::operator=((DescriptorScriptReference *)local_720,&local_18d0);
      DescriptorScriptReference::~DescriptorScriptReference(&local_18d0);
    }
    DescriptorScriptReference::GetKeyList(&local_18e8,(DescriptorScriptReference *)local_720);
    pvVar5 = ::std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[](&local_18e8,0);
    DescriptorKeyReference::operator=((DescriptorKeyReference *)local_d88,pvVar5);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector(&local_18e8);
    DescriptorKeyReference::GetExtPubkey(&local_1958,(DescriptorKeyReference *)local_d88);
    ExtPubkey::operator=(__return_storage_ptr__,&local_1958);
    ExtPubkey::~ExtPubkey(&local_1958);
    ExtPubkey::ToString_abi_cxx11_(&local_1978,__return_storage_ptr__);
    ExtPubkey::ToString_abi_cxx11_((string *)((long)&xpub_str.field_2 + 8),base_ext_pubkey);
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_1978,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (xpub_str.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)(xpub_str.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)&local_1978);
    if (_Var2) {
      ExtPubkey::ToString_abi_cxx11_(&local_19d8,base_ext_pubkey);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_19b8,&local_19d8,"/0/*");
      ::std::__cxx11::string::~string((string *)&local_19d8);
      AVar3 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_1230);
      if (AVar3 == kP2shP2wpkhAddress) {
        ::std::operator+(&local_1a18,"sh(wpkh(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_19b8);
        ::std::operator+(&local_19f8,&local_1a18,"))");
        ::std::__cxx11::string::operator=((string *)local_19b8,(string *)&local_19f8);
        ::std::__cxx11::string::~string((string *)&local_19f8);
        ::std::__cxx11::string::~string((string *)&local_1a18);
      }
      else {
        AVar3 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_1230);
        if (AVar3 == kP2wpkhAddress) {
          ::std::operator+(&local_1a58,"wpkh(",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_19b8);
          ::std::operator+(&local_1a38,&local_1a58,")");
          ::std::__cxx11::string::operator=((string *)local_19b8,(string *)&local_1a38);
          ::std::__cxx11::string::~string((string *)&local_1a38);
          ::std::__cxx11::string::~string((string *)&local_1a58);
        }
        else {
          ::std::operator+(&local_1a98,"pkh(",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_19b8);
          ::std::operator+(&local_1a78,&local_1a98,")");
          ::std::__cxx11::string::operator=((string *)local_19b8,(string *)&local_1a78);
          ::std::__cxx11::string::~string((string *)&local_1a78);
          ::std::__cxx11::string::~string((string *)&local_1a98);
        }
      }
      Descriptor::Parse(&local_1c00,(string *)local_19b8,
                        (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         *)0x0);
      Descriptor::operator=
                ((Descriptor *)
                 &script_ref.addr_prefixes_.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1c00);
      Descriptor::~Descriptor(&local_1c00);
      Descriptor::GetReference
                (&local_1f50,
                 (Descriptor *)
                 &script_ref.addr_prefixes_.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_248);
      DescriptorScriptReference::operator=((DescriptorScriptReference *)local_1230,&local_1f50);
      DescriptorScriptReference::~DescriptorScriptReference(&local_1f50);
      DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)local_720,(DescriptorScriptReference *)local_1230);
      AVar3 = DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_720);
      if (AVar3 == kP2shP2wpkhAddress) {
        DescriptorScriptReference::GetChild(&local_22a0,(DescriptorScriptReference *)local_720);
        DescriptorScriptReference::operator=((DescriptorScriptReference *)local_720,&local_22a0);
        DescriptorScriptReference::~DescriptorScriptReference(&local_22a0);
      }
      DescriptorScriptReference::GetKeyList(&local_22b8,(DescriptorScriptReference *)local_720);
      pvVar5 = ::std::
               vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
               ::operator[](&local_22b8,0);
      DescriptorKeyReference::operator=((DescriptorKeyReference *)local_d88,pvVar5);
      ::std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector(&local_22b8);
      DescriptorKeyReference::GetExtPubkey(&local_2328,(DescriptorKeyReference *)local_d88);
      ExtPubkey::operator=(__return_storage_ptr__,&local_2328);
      ExtPubkey::~ExtPubkey(&local_2328);
      ::std::__cxx11::string::~string((string *)local_19b8);
    }
    if (descriptor_derive_address != (Address *)0x0) {
      DescriptorScriptReference::GenerateAddress
                (&local_24a0,(DescriptorScriptReference *)local_1230,NStack_2c);
      core::Address::operator=(descriptor_derive_address,&local_24a0);
      core::Address::~Address(&local_24a0);
    }
    DescriptorScriptReference::~DescriptorScriptReference((DescriptorScriptReference *)local_1230);
    DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)local_d88);
    DescriptorScriptReference::~DescriptorScriptReference((DescriptorScriptReference *)local_720);
    Descriptor::~Descriptor
              ((Descriptor *)
               &script_ref.addr_prefixes_.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_248);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208);
    ::std::__cxx11::string::~string
              ((string *)
               &check_key.tweak_sum_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ExtPubkey::~ExtPubkey((ExtPubkey *)((long)&desc_str.field_2 + 8));
    return __return_storage_ptr__;
  }
  local_e80.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_e80.filename = local_e80.filename + 1;
  local_e80.line = 0xcff;
  local_e80.funcname = "GenerateExtPubkeyFromDescriptor";
  ExtPubkey::GetVersionData(&local_eb8,(ExtPubkey *)((long)&desc_str.field_2 + 8));
  ByteData::GetHex_abi_cxx11_(&local_ea0,&local_eb8);
  logger::warn<std::__cxx11::string>(&local_e80,"bitcoin_descriptor illegal prefix[{}].",&local_ea0)
  ;
  ::std::__cxx11::string::~string((string *)&local_ea0);
  ByteData::~ByteData(&local_eb8);
  derive_script.addr_prefixes_.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_ed8,"bitcoin_descriptor illegal prefix.",
             (allocator *)
             ((long)&derive_script.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_ed8);
  derive_script.addr_prefixes_.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPubkey ConfidentialTransaction::GenerateExtPubkeyFromDescriptor(
    const std::string &bitcoin_descriptor, uint32_t bip32_counter,
    const ByteData &prefix, NetType net_type, NetType elements_net_type,
    ExtPubkey *base_ext_pubkey, Address *descriptor_derive_address) {
  bool is_liquidv1 = false;
  switch (elements_net_type) {
    case NetType::kMainnet:
    case NetType::kTestnet:
    case NetType::kRegtest:
      throw CfdException(
          kCfdIllegalArgumentError, "Illegal elements network type error.");
    case NetType::kLiquidV1:
      is_liquidv1 = true;
      break;
    case NetType::kElementsRegtest:
    case NetType::kCustomChain:
    default:
      break;
  }

  ExtPubkey child_xpub;
  ExtPubkey xpub;
  std::string desc_str = bitcoin_descriptor;
  try {
    // check extkey (not output descriptor)
    ExtPubkey check_key(bitcoin_descriptor);
    if (check_key.GetVersionData().Equals(prefix)) {
      desc_str = "pkh(" + bitcoin_descriptor + ")";  // create pkh descriptor
    }
  } catch (const CfdException &except) {
    info(
        CFD_LOG_SOURCE, "bitcoin_descriptor check fail. go on next check.({})",
        except.what());
    // other descriptor
  }

  std::vector<std::string> arg_list_base;
  arg_list_base.push_back(std::string(kArgumentBaseExtkey));
  std::vector<std::string> arg_list;
  arg_list.push_back(std::to_string(bip32_counter));
  Descriptor desc = Descriptor::Parse(desc_str);
  DescriptorScriptReference script_ref = desc.GetReference(&arg_list_base);
  switch (script_ref.GetAddressType()) {
    case AddressType::kP2pkhAddress:
      break;
    case AddressType::kP2wpkhAddress:
    case AddressType::kP2shP2wpkhAddress:
      if (is_liquidv1) {
        warn(
            CFD_LOG_SOURCE, "liquidv1 not supported address type[{}].",
            script_ref.GetAddressType());
        throw CfdException(
            kCfdIllegalArgumentError,
            "bitcoin_descriptor is not of any type supported: pkh(<xpub>)");
      }
      break;
    default:
      warn(CFD_LOG_SOURCE, "bitcoin_descriptor invalid type.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "bitcoin_descriptor is not of any type supported: pkh(<xpub>), "
          "sh(wpkh(<xpub>)), wpkh(<xpub>), or <xpub>.");
  }

  if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
    script_ref = script_ref.GetChild();
  }
  DescriptorKeyReference key_ref = script_ref.GetKeyList()[0];
  if (!key_ref.HasExtPubkey()) {
    warn(CFD_LOG_SOURCE, "bitcoin_descriptor invalid extkey format.");
    throw CfdException(
        kCfdIllegalArgumentError, "BitcoinDescriptor invalid extkey format.");
  }
  *base_ext_pubkey = key_ref.GetExtPubkey();
  if (!base_ext_pubkey->GetVersionData().Equals(prefix)) {
    warn(
        CFD_LOG_SOURCE, "bitcoin_descriptor illegal prefix[{}].",
        xpub.GetVersionData().GetHex());
    throw CfdException(
        kCfdIllegalArgumentError, "bitcoin_descriptor illegal prefix.");
  }

  // collect derive key
  DescriptorScriptReference derive_script;
  derive_script = desc.GetReference(&arg_list);
  script_ref = derive_script;
  if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
    script_ref = script_ref.GetChild();
  }
  key_ref = script_ref.GetKeyList()[0];
  child_xpub = key_ref.GetExtPubkey();

  // If it is the same as base, add a default path.
  if (child_xpub.ToString() == base_ext_pubkey->ToString()) {
    std::string xpub_str = base_ext_pubkey->ToString() + "/0/*";
    if (derive_script.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
      xpub_str = "sh(wpkh(" + xpub_str + "))";
    } else if (derive_script.GetAddressType() == AddressType::kP2wpkhAddress) {
      xpub_str = "wpkh(" + xpub_str + ")";
    } else {
      xpub_str = "pkh(" + xpub_str + ")";
    }
    desc = Descriptor::Parse(xpub_str);
    derive_script = desc.GetReference(&arg_list);
    script_ref = derive_script;
    if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
      script_ref = script_ref.GetChild();
    }
    key_ref = script_ref.GetKeyList()[0];
    child_xpub = key_ref.GetExtPubkey();
  }

  if (descriptor_derive_address != nullptr) {
    *descriptor_derive_address = derive_script.GenerateAddress(net_type);
  }
  return child_xpub;
}